

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiWindowSettings *pIVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = -0x20;
  do {
    lVar3 = lVar2;
    if ((ulong)(uint)(GImGui->SettingsWindows).Size << 5 == lVar3 + 0x20) {
      return (ImGuiWindowSettings *)0x0;
    }
    pIVar1 = (GImGui->SettingsWindows).Data;
    lVar2 = lVar3 + 0x20;
  } while (*(ImGuiID *)((long)&pIVar1[1].ID + lVar3) != id);
  return (ImGuiWindowSettings *)((long)&pIVar1[1].Name + lVar3);
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}